

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O1

int32_t ucal_getCanonicalTimeZoneID_63
                  (UChar *id,int32_t len,UChar *result,int32_t resultCapacity,UBool *isSystemID,
                  UErrorCode *status)

{
  int32_t iVar1;
  UBool systemID;
  UnicodeString canonical;
  UBool local_c1;
  Char16Ptr local_c0;
  UChar *local_b8;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  iVar1 = 0;
  if ((status != (UErrorCode *)0x0) && (iVar1 = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (isSystemID != (UBool *)0x0) {
      *isSystemID = '\0';
    }
    if ((result == (UChar *)0x0 || (len == 0 || id == (UChar *)0x0)) || resultCapacity < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0
      ;
      local_a8.fUnion.fStackFields.fLengthAndFlags = 2;
      local_c1 = '\0';
      icu_63::UnicodeString::UnicodeString(&local_68,id,len);
      icu_63::TimeZone::getCanonicalID(&local_68,&local_a8,&local_c1,status);
      icu_63::UnicodeString::~UnicodeString(&local_68);
      iVar1 = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (isSystemID != (UBool *)0x0) {
          *isSystemID = local_c1;
        }
        local_c0.p_ = result;
        iVar1 = icu_63::UnicodeString::extract(&local_a8,&local_c0,resultCapacity,status);
        local_b8 = local_c0.p_;
      }
      icu_63::UnicodeString::~UnicodeString(&local_a8);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getCanonicalTimeZoneID(const UChar* id, int32_t len,
                            UChar* result, int32_t resultCapacity, UBool *isSystemID, UErrorCode* status) {
    if(status == 0 || U_FAILURE(*status)) {
        return 0;
    }
    if (isSystemID) {
        *isSystemID = FALSE;
    }
    if (id == 0 || len == 0 || result == 0 || resultCapacity <= 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t reslen = 0;
    UnicodeString canonical;
    UBool systemID = FALSE;
    TimeZone::getCanonicalID(UnicodeString(id, len), canonical, systemID, *status);
    if (U_SUCCESS(*status)) {
        if (isSystemID) {
            *isSystemID = systemID;
        }
        reslen = canonical.extract(result, resultCapacity, *status);
    }
    return reslen;
}